

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O0

void __thiscall Environment::define(Environment *this,Function *function)

{
  bool bVar1;
  size_t sVar2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>_>
  *puVar3;
  size_type sVar4;
  mapped_type *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>
  local_130;
  EnvironmentScope *local_90;
  EnvironmentScope *scope;
  pair<const_ResultValueType,_EnvironmentScope> *current;
  iterator __end1;
  iterator __begin1;
  unordered_map<ResultValueType,_EnvironmentScope,_std::hash<ResultValueType>,_std::equal_to<ResultValueType>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>_>
  *__range1;
  string local_58;
  undefined1 local_38 [8];
  string funcName;
  Function *function_local;
  Environment *this_local;
  
  funcName.field_2._8_8_ = function;
  Function::name_abi_cxx11_(&local_58,function);
  sVar2 = Function::numParameters(function);
  anon_unknown.dwarf_3ef85::getFuncName((string *)local_38,&local_58,(long)(int)sVar2);
  std::__cxx11::string::~string((string *)&local_58);
  __end1 = std::
           unordered_map<ResultValueType,_EnvironmentScope,_std::hash<ResultValueType>,_std::equal_to<ResultValueType>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>_>
           ::begin(&this->mScopes);
  current = (pair<const_ResultValueType,_EnvironmentScope> *)
            std::
            unordered_map<ResultValueType,_EnvironmentScope,_std::hash<ResultValueType>,_std::equal_to<ResultValueType>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>_>
            ::end(&this->mScopes);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_ResultValueType,_EnvironmentScope>,_true>
                       ,(_Node_iterator_base<std::pair<const_ResultValueType,_EnvironmentScope>,_true>
                         *)&current);
    if (!bVar1) break;
    scope = (EnvironmentScope *)
            std::__detail::
            _Node_iterator<std::pair<const_ResultValueType,_EnvironmentScope>,_false,_true>::
            operator*(&__end1);
    local_90 = &((reference)scope)->second;
    puVar3 = EnvironmentScope::functions_abi_cxx11_(local_90);
    sVar4 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>_>
            ::count(puVar3,(key_type *)local_38);
    if (sVar4 == 0) {
      puVar3 = EnvironmentScope::functions_abi_cxx11_(local_90);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Function_&,_true>
                (&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 function);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>_>
      ::insert(puVar3,&local_130);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>
      ::~pair(&local_130);
    }
    else {
      puVar3 = EnvironmentScope::functions_abi_cxx11_(local_90);
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>_>
                ::at(puVar3,(key_type *)local_38);
      Function::operator=(this_00,function);
    }
    std::__detail::_Node_iterator<std::pair<const_ResultValueType,_EnvironmentScope>,_false,_true>::
    operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Environment::define(Function function) {
	auto funcName = getFuncName(function.name(), (int) function.numParameters());

	for (auto& current : mScopes) {
		auto& scope = current.second;
		if (scope.functions().count(funcName) == 0) {
			scope.functions().insert({ funcName, function });
		} else {
			scope.functions().at(funcName) = function;
		}
	}
}